

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O3

Quaternion<double> * __thiscall
OpenMD::SquareMatrix3<double>::toQuaternion
          (Quaternion<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[3] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] = 0.0;
  dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dVar4 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar6 = dVar1 + dVar5 + dVar4 + 1.0;
  if (dVar6 <= 2.220446049250313e-16) {
    if ((dVar1 < dVar5) || (dVar1 < dVar4)) {
      if ((dVar5 < dVar1) || (dVar5 < dVar4)) {
        dVar5 = ((dVar4 + 1.0) - dVar1) - dVar5;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        dVar5 = 0.5 / dVar5;
        dVar1 = dVar5 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_[2][0] +
                        (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                        [0][2]);
        auVar3._8_4_ = SUB84(dVar1,0);
        auVar3._0_8_ = dVar5 * ((this->super_SquareMatrix<double,_3>).
                                super_RectMatrix<double,_3U,_3U>.data_[0][1] -
                               (this->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[1][0]);
        auVar3._12_4_ = (int)((ulong)dVar1 >> 0x20);
        *(undefined1 (*) [16])(__return_storage_ptr__->super_Vector<double,_4U>).data_ = auVar3;
        (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] =
             ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] +
             (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1]) *
             dVar5;
        dVar5 = 0.25 / dVar5;
        goto LAB_0013d8cc;
      }
      dVar4 = ((dVar5 + 1.0) - dVar1) - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar6 = 0.5 / dVar4;
      dVar1 = dVar6 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                       [0][1] + (this->super_SquareMatrix<double,_3>).
                                super_RectMatrix<double,_3U,_3U>.data_[1][0]);
      auVar2._8_4_ = SUB84(dVar1,0);
      auVar2._0_8_ = dVar6 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                              .data_[2][0] -
                             (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                             data_[0][2]);
      auVar2._12_4_ = (int)((ulong)dVar1 >> 0x20);
      *(undefined1 (*) [16])(__return_storage_ptr__->super_Vector<double,_4U>).data_ = auVar2;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] = 0.25 / dVar6;
      dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] +
              (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
    }
    else {
      dVar4 = ((dVar1 + 1.0) - dVar5) - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar6 = 0.5 / dVar4;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] =
           ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] -
           (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1]) *
           dVar6;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] = 0.25 / dVar6;
      (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] =
           ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] +
           (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0]) *
           dVar6;
      dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] +
              (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
    }
  }
  else {
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = 0.5 / dVar6;
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[0] = 0.25 / dVar6;
    dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
    dVar1 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[1] =
         dVar6 * ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2]
                 - (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
                   [1]);
    (__return_storage_ptr__->super_Vector<double,_4U>).data_[2] = dVar6 * (dVar5 - dVar1);
    dVar5 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] -
            (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  }
  dVar5 = dVar5 * dVar6;
LAB_0013d8cc:
  (__return_storage_ptr__->super_Vector<double,_4U>).data_[3] = dVar5;
  return __return_storage_ptr__;
}

Assistant:

Quaternion<Real> toQuaternion() {
      Quaternion<Real> q;
      Real t, s;
      Real ad1, ad2, ad3;
      t = this->data_[0][0] + this->data_[1][1] + this->data_[2][2] + 1.0;

      if (t > std::numeric_limits<RealType>::epsilon()) {
        s    = 0.5 / sqrt(t);
        q[0] = 0.25 / s;
        q[1] = (this->data_[1][2] - this->data_[2][1]) * s;
        q[2] = (this->data_[2][0] - this->data_[0][2]) * s;
        q[3] = (this->data_[0][1] - this->data_[1][0]) * s;
      } else {
        ad1 = this->data_[0][0];
        ad2 = this->data_[1][1];
        ad3 = this->data_[2][2];

        if (ad1 >= ad2 && ad1 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[0][0] - this->data_[1][1] -
                            this->data_[2][2]);
          q[0] = (this->data_[1][2] - this->data_[2][1]) * s;
          q[1] = 0.25 / s;
          q[2] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[3] = (this->data_[0][2] + this->data_[2][0]) * s;
        } else if (ad2 >= ad1 && ad2 >= ad3) {
          s    = 0.5 / sqrt(1.0 + this->data_[1][1] - this->data_[0][0] -
                            this->data_[2][2]);
          q[0] = (this->data_[2][0] - this->data_[0][2]) * s;
          q[1] = (this->data_[0][1] + this->data_[1][0]) * s;
          q[2] = 0.25 / s;
          q[3] = (this->data_[1][2] + this->data_[2][1]) * s;
        } else {
          s    = 0.5 / sqrt(1.0 + this->data_[2][2] - this->data_[0][0] -
                            this->data_[1][1]);
          q[0] = (this->data_[0][1] - this->data_[1][0]) * s;
          q[1] = (this->data_[0][2] + this->data_[2][0]) * s;
          q[2] = (this->data_[1][2] + this->data_[2][1]) * s;
          q[3] = 0.25 / s;
        }
      }

      return q;
    }